

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O0

KcpTcpEventLoop * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getNextLoop(KcpTcpEventLoopThreadPool *this)

{
  bool bVar1;
  reference ppKVar2;
  unsigned_long uVar3;
  size_type sVar4;
  value_type local_18;
  KcpTcpEventLoop *loop;
  KcpTcpEventLoopThreadPool *this_local;
  
  EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
  if ((this->m_started & 1U) == 0) {
    __assert_fail("m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                  ,0x3c,"KcpTcpEventLoop *sznet::net::KcpTcpEventLoopThreadPool::getNextLoop()");
  }
  local_18 = this->m_baseLoop;
  bVar1 = std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
          ::empty(&this->m_loops);
  if (!bVar1) {
    ppKVar2 = std::
              vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
              ::operator[](&this->m_loops,(long)this->m_next);
    local_18 = *ppKVar2;
    this->m_next = this->m_next + 1;
    uVar3 = implicit_cast<unsigned_long,int>(&this->m_next);
    sVar4 = std::
            vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
            size(&this->m_loops);
    if (sVar4 <= uVar3) {
      this->m_next = 0;
    }
  }
  return local_18;
}

Assistant:

KcpTcpEventLoop* KcpTcpEventLoopThreadPool::getNextLoop()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	KcpTcpEventLoop* loop = m_baseLoop;

	if (!m_loops.empty())
	{
		// round-robin
		loop = m_loops[m_next];
		++m_next;
		if (implicit_cast<size_t>(m_next) >= m_loops.size())
		{
			m_next = 0;
		}
	}
	return loop;
}